

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::ShaderBindingTableBase
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,
          IReferenceCounters *pRefCounters,RenderDeviceImplType *pDevice,
          ShaderBindingTableDesc *Desc,bool bIsDeviceInternal)

{
  RenderDeviceVkImpl *pRVar1;
  GraphicsAdapterInfo *pGVar2;
  DeviceFeatures *pDVar3;
  PipelineStateVkImpl *pPVar4;
  RayTracingPipelineDesc *pRVar5;
  RayTracingProperties *RTProps;
  bool bIsDeviceInternal_local;
  ShaderBindingTableDesc *Desc_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this_local;
  
  DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
  ).super_ObjectBase<Diligent::IShaderBindingTableVk>.
  super_RefCountedObject<Diligent::IShaderBindingTableVk>.super_IShaderBindingTableVk.
  super_IShaderBindingTable.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_010d5288;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_RayGenShaderRecord);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_MissShadersRecord);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_CallableShadersRecord)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_HitGroupsRecord);
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::RefCntAutoPtr(&this->m_pPSO);
  RefCntAutoPtr<Diligent::BufferVkImpl>::RefCntAutoPtr(&this->m_pBuffer);
  this->m_ShaderRecordSize = 0;
  this->m_ShaderRecordStride = 0;
  this->m_Changed = true;
  std::
  vector<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding,_std::allocator<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding>_>
  ::vector(&this->m_DbgHitGroupBindings);
  pRVar1 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  pGVar2 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar1);
  pRVar1 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  pDVar3 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetFeatures
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar1);
  if (pDVar3->RayTracing == DEVICE_FEATURE_STATE_DISABLED) {
    LogError<true,char[39]>
              (false,"ShaderBindingTableBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x56,(char (*) [39])"Ray tracing is not supported by device");
  }
  ValidateShaderBindingTableDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
              ).m_Desc,(pGVar2->RayTracing).ShaderGroupHandleSize,
             (pGVar2->RayTracing).MaxShaderRecordStride);
  pPVar4 = ClassPtrCast<Diligent::PipelineStateVkImpl,Diligent::IPipelineState>
                     ((this->
                      super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      ).m_Desc.pPSO);
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=(&this->m_pPSO,pPVar4);
  pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPSO);
  pRVar5 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetRayTracingPipelineDesc
                     (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  this->m_ShaderRecordSize = (uint)pRVar5->ShaderRecordSize;
  this->m_ShaderRecordStride = this->m_ShaderRecordSize + (pGVar2->RayTracing).ShaderGroupHandleSize
  ;
  return;
}

Assistant:

ShaderBindingTableBase(IReferenceCounters*           pRefCounters,
                           RenderDeviceImplType*         pDevice,
                           const ShaderBindingTableDesc& Desc,
                           bool                          bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        const RayTracingProperties& RTProps = this->GetDevice()->GetAdapterInfo().RayTracing;
        if (!this->GetDevice()->GetFeatures().RayTracing)
            LOG_ERROR_AND_THROW("Ray tracing is not supported by device");

        ValidateShaderBindingTableDesc(this->m_Desc, RTProps.ShaderGroupHandleSize, RTProps.MaxShaderRecordStride);

        this->m_pPSO               = ClassPtrCast<PipelineStateImplType>(this->m_Desc.pPSO);
        this->m_ShaderRecordSize   = this->m_pPSO->GetRayTracingPipelineDesc().ShaderRecordSize;
        this->m_ShaderRecordStride = this->m_ShaderRecordSize + RTProps.ShaderGroupHandleSize;
    }